

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 65816Storage.cpp
# Opt level: O2

void CPU::WDC65816::ProcessorStorageConstructor::stack_rts
               (AccessType param_1,bool param_2,function<void_(CPU::WDC65816::MicroOp)> *target)

{
  std::function<void_(CPU::WDC65816::MicroOp)>::operator()(target,CycleFetchPCThrowaway);
  std::function<void_(CPU::WDC65816::MicroOp)>::operator()(target,CycleFetchPCThrowaway);
  std::function<void_(CPU::WDC65816::MicroOp)>::operator()(target,CyclePull);
  std::function<void_(CPU::WDC65816::MicroOp)>::operator()(target,CyclePull);
  std::function<void_(CPU::WDC65816::MicroOp)>::operator()(target,CycleFetchPreviousThrowaway);
  std::function<void_(CPU::WDC65816::MicroOp)>::operator()(target,OperationPerform);
  return;
}

Assistant:

static void stack_rts(AccessType, bool, const std::function<void(MicroOp)> &target) {
		target(CycleFetchPCThrowaway);			// IO.
		target(CycleFetchPCThrowaway);			// IO.

		target(CyclePull);						// PCL.
		target(CyclePull);						// PCH.
		target(CycleFetchPreviousThrowaway);	// IO.

		target(OperationPerform);				// [RTS]
	}